

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O0

void ogl_draw_bitmap_region
               (ALLEGRO_BITMAP *bitmap,ALLEGRO_COLOR tint,float sx,float sy,float sw,float sh,
               int flags)

{
  ALLEGRO_COLOR tint_00;
  ALLEGRO_COLOR tint_01;
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  ALLEGRO_TRANSFORM *trans;
  ALLEGRO_BITMAP *in_RDI;
  int iVar4;
  ALLEGRO_BITMAP *in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  undefined8 unaff_retaddr;
  float ytrans;
  float xtrans;
  ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_source;
  ALLEGRO_DISPLAY *disp;
  ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
  ALLEGRO_BITMAP *target;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float local_58;
  float local_54;
  void *local_50;
  ALLEGRO_DISPLAY *local_48;
  void *local_40;
  ALLEGRO_BITMAP *local_38;
  float local_28;
  float sx_00;
  
  local_28 = in_XMM5_Da;
  local_38 = al_get_target_bitmap();
  local_48 = _al_get_bitmap_display(local_38);
  if (local_38->parent != (ALLEGRO_BITMAP *)0x0) {
    local_38 = local_38->parent;
  }
  local_40 = local_38->extra;
  uVar2 = al_get_bitmap_flags(in_RDI);
  if (((((uVar2 & 1) == 0) && ((in_RDI->locked & 1U) == 0)) && ((local_38->locked & 1U) == 0)) &&
     (local_50 = in_RDI->extra, (*(byte *)((long)local_50 + 0x38) & 1) != 0)) {
    trans = al_get_current_transform();
    _Var1 = _al_transform_is_translation(trans,&local_54,&local_58);
    if (_Var1) {
      if (*(long *)((long)local_40 + 0x10) != 0) {
        _al_ogl_set_target_bitmap
                  ((ALLEGRO_DISPLAY *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (ALLEGRO_BITMAP *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      }
      if (local_54 < (float)local_38->cl) {
        in_XMM2_Da = in_XMM2_Da - (local_54 - (float)local_38->cl);
        in_XMM4_Da = (local_54 - (float)local_38->cl) + in_XMM4_Da;
        local_54 = (float)local_38->cl;
      }
      if (local_58 < (float)local_38->ct) {
        in_XMM3_Da = in_XMM3_Da - (local_58 - (float)local_38->ct);
        local_28 = (local_58 - (float)local_38->ct) + local_28;
        local_58 = (float)local_38->ct;
      }
      if ((float)local_38->cr_excl < local_54 + in_XMM4_Da) {
        in_XMM4_Da = (float)local_38->cr_excl - local_54;
      }
      if ((float)local_38->cb_excl < local_58 + local_28) {
        local_28 = (float)local_38->cb_excl - local_58;
      }
      glBindTexture(0xde1,*(undefined4 *)((long)local_40 + 8));
      iVar4 = (int)in_XMM4_Da;
      iVar3 = (int)local_28;
      glCopyTexSubImage2D(0xde1,0,(int)local_54,(int)(((float)local_38->h - local_58) - local_28),
                          (int)in_XMM2_Da,(int)(((float)in_RDI->h - in_XMM3_Da) - local_28));
      if (*(long *)((long)local_40 + 0x10) == 0) {
        return;
      }
      _al_ogl_set_target_bitmap
                ((ALLEGRO_DISPLAY *)CONCAT44(in_stack_ffffffffffffffa4,iVar3),
                 (ALLEGRO_BITMAP *)CONCAT44(in_stack_ffffffffffffff9c,iVar4));
      return;
    }
  }
  sx_00 = (float)((ulong)in_RDI >> 0x20);
  if (local_48->ogl_extras->opengl_target == local_38) {
    tint_00._8_8_ = unaff_retaddr;
    tint_00.r = (float)(int)in_XMM1_Qa;
    tint_00.g = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    draw_quad(in_XMM0_Qa,tint_00,sx_00,SUB84(in_RDI,0),in_XMM2_Da,in_XMM3_Da,(int)in_XMM4_Da);
  }
  else {
    tint_01._8_8_ = unaff_retaddr;
    tint_01.r = (float)(int)in_XMM1_Qa;
    tint_01.g = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    _al_draw_bitmap_region_memory
              (in_XMM0_Qa,tint_01,(int)sx_00,(int)SUB84(in_RDI,0),(int)in_XMM2_Da,(int)in_XMM3_Da,
               (int)in_XMM4_Da,(int)disp,(int)ogl_target);
  }
  return;
}

Assistant:

static void ogl_draw_bitmap_region(ALLEGRO_BITMAP *bitmap,
   ALLEGRO_COLOR tint, float sx, float sy,
   float sw, float sh, int flags)
{
   // FIXME: hack
   // FIXME: need format conversion if they don't match
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
   ALLEGRO_DISPLAY *disp = _al_get_bitmap_display(target);

   /* For sub-bitmaps */
   if (target->parent) {
      target = target->parent;
   }

   ogl_target = target->extra;

   if (!(al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) && !bitmap->locked &&
         !target->locked) {
      ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_source = bitmap->extra;
      if (ogl_source->is_backbuffer) {
         /* Our source bitmap is the OpenGL backbuffer, the target
          * is an OpenGL texture.
          */
         float xtrans, ytrans;

         /* Source and target cannot both be the back-buffer. */
         ASSERT(!ogl_target->is_backbuffer);

         /* If we only translate, we can do this fast. */
         if (_al_transform_is_translation(al_get_current_transform(),
            &xtrans, &ytrans)) {
            /* In general, we can't modify the texture while it's
             * FBO bound - so we temporarily disable the FBO.
             */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, bitmap);
            
            /* We need to do clipping because glCopyTexSubImage2D
             * fails otherwise.
             */
            if (xtrans < target->cl) {
               sx -= xtrans - target->cl;
               sw += xtrans - target->cl;
               xtrans = target->cl;
            }
            if (ytrans < target->ct) {
               sy -= ytrans - target->ct;
               sh += ytrans - target->ct;
               ytrans = target->ct;
            }
            if (xtrans + sw > target->cr_excl) {
               sw = target->cr_excl - xtrans;
            }
            if (ytrans + sh > target->cb_excl) {
               sh = target->cb_excl - ytrans;
            }

            /* Note: Allegro 5.0.0 does not support blending or
             * tinting if the source bitmap is the screen. So it is
             * correct to ignore them here.
             */

            glBindTexture(GL_TEXTURE_2D, ogl_target->texture);
            glCopyTexSubImage2D(GL_TEXTURE_2D, 0,
                xtrans, target->h - ytrans - sh,
                sx, bitmap->h - sy - sh,
                sw, sh);
            /* Fix up FBO again after the copy. */
            if (ogl_target->fbo_info)
               _al_ogl_set_target_bitmap(disp, target);
            return;
         }
         
         /* Drawing a deformed backbuffer is not supported. */
         ASSERT(0);
      }
   }
   if (disp->ogl_extras->opengl_target == target) {
      draw_quad(bitmap, tint, sx, sy, sw, sh, flags);
      return;
   }

   /* If all else fails, fall back to software implementation. */
   _al_draw_bitmap_region_memory(bitmap, tint, sx, sy, sw, sh, 0, 0, flags);
}